

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

bool IsStructArgumentType(TypeBase *type)

{
  return false;
}

Assistant:

bool IsStructArgumentType(TypeBase *type)
{
#if defined(_WIN64)
	if(isType<TypeVoid>(type))
		return false;

	return type->size != 1 && type->size != 2 && type->size != 4 && type->size != 8;
#else
	(void)type;

	return false;
#endif
}